

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex_tests.cpp
# Opt level: O1

void __thiscall
coinstatsindex_tests::coinstatsindex_unclean_shutdown::test_method
          (coinstatsindex_unclean_shutdown *this)

{
  NodeContext *context;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar5;
  readonly_property<bool> rVar6;
  bool bVar7;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar8;
  Chainstate *chainstate;
  CChainParams *consensusParams;
  SignalInterrupt **ppSVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  CCoinsViewCache *baseIn;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar10;
  iterator pvVar11;
  Chainstate *pCVar12;
  iterator pvVar13;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  CBlockIndex *new_block_index;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CCoinsViewCache view;
  BlockValidationState state;
  CBlock block;
  CScript script_pub_key;
  CoinStatsIndex index;
  check_type in_stack_fffffffffffff700;
  check_type cVar14;
  undefined4 in_stack_fffffffffffff704;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  long *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  assertion_result local_848;
  char **local_830;
  assertion_result local_828;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  CBlockIndex *local_790;
  shared_ptr<const_CBlock> local_788;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  long *local_710;
  unique_lock<std::recursive_mutex> local_708;
  undefined1 local_6f8 [16];
  pointer local_6e8;
  ValidationState<BlockValidationResult> *local_6e0;
  PoolResource<144UL,_8UL> local_6c0;
  CoinsCachePair *local_5d0;
  CoinsCachePair *local_5c8;
  uint8_t local_5c0;
  direct_or_indirect local_5b0;
  uint local_594;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_588;
  ValidationState<BlockValidationResult> local_530;
  undefined1 local_4e8 [24];
  uchar auStack_4d0 [4];
  uint local_4cc;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_498;
  direct_or_indirect local_470;
  uint local_454;
  CoinStatsIndex local_450;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  context = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node;
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  puVar8 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
                      ,0x53,"test_method","m_node.chainman");
  chainstate = ChainstateManager::ActiveChainstate
                         ((puVar8->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  consensusParams = Params();
  interfaces::MakeChain((interfaces *)&local_710,context);
  pvVar11 = (iterator)0x0;
  CoinStatsIndex::CoinStatsIndex
            (&local_450,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)&local_710,
             0x100000,false,false);
  if (local_710 != (long *)0x0) {
    (**(code **)(*local_710 + 8))();
  }
  local_710 = (long *)0x0;
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x57;
  file.m_begin = (iterator)&local_720;
  msg.m_end = in_R9;
  msg.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_730,msg);
  rVar6.super_class_property<bool>.value =
       (class_property<bool>)BaseIndex::Init(&local_450.super_BaseIndex);
  local_4e8._8_8_ = (element_type *)0x0;
  local_4e8._16_8_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "index.Init()";
  local_530.m_reject_reason._M_dataplus._M_p = "";
  local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffffffffff00;
  local_6f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_6e8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_738 = "";
  pvVar11 = (iterator)0x2;
  pvVar13 = (iterator)0x0;
  local_6e0 = &local_530;
  local_4e8[0] = rVar6.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4e8,(lazy_ostream *)local_6f8,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),(size_t)&local_740,0x57);
  boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 0x10));
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = &DAT_00000058;
  file_00.m_begin = (iterator)&local_750;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_760,
             msg_00);
  local_4e8[0] = BaseIndex::StartBackgroundSync(&local_450.super_BaseIndex);
  local_4e8._8_8_ = (element_type *)0x0;
  local_4e8._16_8_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "index.StartBackgroundSync()";
  local_530.m_reject_reason._M_dataplus._M_p = "";
  local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffffffffff00;
  local_6f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_6e8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_768 = "";
  pvVar11 = (iterator)0x0;
  local_6e0 = &local_530;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4e8,(lazy_ostream *)local_6f8,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),(size_t)&local_770,0x58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 0x10));
  ppSVar9 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.shutdown,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
                       ,0x59,"test_method","m_node.shutdown");
  IndexWaitSynced(&local_450.super_BaseIndex,*ppSVar9);
  local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_790 = (CBlockIndex *)0x0;
  local_4e8._16_8_ = (sp_counted_base *)0x0;
  auStack_4d0[0] = '\0';
  auStack_4d0[1] = '\0';
  auStack_4d0[2] = '\0';
  auStack_4d0[3] = '\0';
  local_4cc._0_1_ = '\0';
  local_4cc._1_1_ = '\0';
  local_4cc._2_1_ = '\0';
  local_4cc._3_1_ = '\0';
  local_4e8._0_8_ = (char *)0x0;
  local_4e8._8_8_ = (element_type *)0x0;
  CKey::GetPubKey((CPubKey *)local_6f8,&(this->super_TestChain100Setup).coinbaseKey);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_530,
             (CPubKey *)local_6f8);
  b._M_extent._M_extent_value = (long)local_530.m_reject_reason._M_dataplus._M_p - local_530._0_8_;
  b._M_ptr = (pointer)local_530._0_8_;
  this_01 = &CScript::operator<<((CScript *)local_4e8,b)->super_CScriptBase;
  uVar3 = this_01->_size;
  uVar4 = uVar3 - 0x1d;
  if (uVar3 < 0x1d) {
    uVar4 = uVar3;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_01->_union).indirect_contents.indirect;
  if (uVar3 < 0x1d) {
    ppVar10 = this_01;
  }
  local_848.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_01,(uchar *)((long)&ppVar10->_union + (long)(int)uVar4),(uchar *)&local_848);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_470.indirect_contents,
             this_01);
  if ((pointer)local_530._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_530._0_8_,
                    local_530.m_reject_reason._M_string_length - local_530._0_8_);
  }
  if (0x1c < local_4cc) {
    free((void *)local_4e8._0_8_);
    local_4e8._0_8_ = (char *)0x0;
  }
  local_6f8._0_8_ = (CBlock *)0x0;
  local_6f8._8_8_ = (pointer)0x0;
  local_6e8 = (pointer)0x0;
  pCVar12 = chainstate;
  TestChain100Setup::CreateBlock
            ((CBlock *)local_4e8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_6f8,
             (CScript *)&local_470.indirect_contents,chainstate);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_6f8);
  local_6f8._0_8_ = (CBlock *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlock,std::allocator<CBlock>,CBlock_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6f8 + 8),(CBlock **)local_6f8,
             (allocator<CBlock> *)&local_530,(CBlock *)local_4e8);
  uVar5 = local_6f8._8_8_;
  local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6f8._0_8_;
  this_00._M_pi =
       local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_6f8._0_8_ = (CBlock *)0x0;
  local_6f8._8_8_ = (pointer)0x0;
  local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if ((pointer)local_6f8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6f8._8_8_);
  }
  local_708._M_device = &cs_main.super_recursive_mutex;
  local_708._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_708);
  paVar1 = &local_530.m_reject_reason.field_2;
  local_530.m_mode = M_VALID;
  local_530.m_result = BLOCK_RESULT_UNSET;
  local_530.m_reject_reason._M_string_length = 0;
  local_530.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_530.m_debug_message.field_2;
  local_530.m_debug_message._M_string_length = 0;
  local_530.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x64;
  file_01.m_begin = (iterator)&local_7a0;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = (iterator)pCVar12;
  local_530.m_reject_reason._M_dataplus._M_p = (pointer)paVar1;
  local_530.m_debug_message._M_dataplus._M_p = (pointer)paVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7b0,
             msg_01);
  rVar6.super_class_property<bool>.value =
       (class_property<bool>)
       CheckBlock((CBlock *)local_4e8,(BlockValidationState *)&local_530,&consensusParams->consensus
                  ,true,true);
  local_848.m_message.px = (element_type *)0x0;
  local_848.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_828._0_8_ = "CheckBlock(block, state, params.GetConsensus())";
  local_828.m_message.px = (element_type *)0xe6e040;
  local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffffffffff00;
  local_6f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_6e8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7b8 = "";
  pvVar11 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_6e0 = (ValidationState<BlockValidationResult> *)&local_828;
  local_848.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar6.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_848,(lazy_ostream *)local_6f8,1,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),(size_t)&local_7c0,100);
  boost::detail::shared_count::~shared_count(&local_848.m_message.pn);
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x65;
  file_02.m_begin = (iterator)&local_7d0;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_7e0,
             msg_02);
  cVar14 = CHECK_MSG;
  local_848.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ChainstateManager::AcceptBlock
                 ((val->_M_t).
                  super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                  .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_788,
                  (BlockValidationState *)&local_530,&local_790,true,(FlatFilePos *)0x0,(bool *)0x0,
                  true);
  local_848.m_message.px = (element_type *)0x0;
  local_848.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_828._0_8_ =
       "m_node.chainman->AcceptBlock(new_block, state, &new_block_index, true, nullptr, nullptr, true)"
  ;
  local_828.m_message.px = (element_type *)0xe6e09f;
  local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffffffffff00;
  local_6f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_6e8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7e8 = "";
  pvVar11 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_6e0 = (ValidationState<BlockValidationResult> *)&local_828;
  boost::test_tools::tt_detail::report_assertion
            (&local_848,(lazy_ostream *)local_6f8,1,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,cVar14),(size_t)&local_7f0,0x65);
  boost::detail::shared_count::~shared_count(&local_848.m_message.pn);
  baseIn = Chainstate::CoinsTip(chainstate);
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)local_6f8,(CCoinsView *)baseIn,false);
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x67;
  file_03.m_begin = (iterator)&local_800;
  msg_03.m_end = pvVar13;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_810,
             msg_03);
  bVar7 = Chainstate::ConnectBlock
                    (chainstate,(CBlock *)local_4e8,(BlockValidationState *)&local_530,local_790,
                     (CCoinsViewCache *)local_6f8,false);
  local_828.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar7;
  local_828.m_message.px = (element_type *)0x0;
  local_828.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_830 = &local_858;
  local_858 = "chainstate.ConnectBlock(block, state, new_block_index, view)";
  local_850 = "";
  local_848.m_message.px = (element_type *)((ulong)local_848.m_message.px & 0xffffffffffffff00);
  local_848._0_8_ = &PTR__lazy_ostream_013abc70;
  local_848.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_860 = "";
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_828,(lazy_ostream *)&local_848,1,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,cVar14),(size_t)&local_868,0x67);
  boost::detail::shared_count::~shared_count(&local_828.m_message.pn);
  local_6f8._0_8_ = &PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_588);
  if (local_5c0 != '\0') {
    (local_5c8->second).m_prev = local_5d0;
    (local_5d0->second).m_next = local_5c8;
    local_5c0 = '\0';
  }
  if (0x1c < local_594) {
    free(local_5b0.indirect_contents.indirect);
    local_5b0.indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&local_6c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_debug_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_530.m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_530.m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_530.m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_reject_reason._M_dataplus._M_p != paVar1) {
    operator_delete(local_530.m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_530.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_530.m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_708);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_498);
  if (0x1c < local_454) {
    free(local_470.indirect_contents.indirect);
    local_470.indirect_contents.indirect = (char *)0x0;
  }
  ValidationInterfaceTest::BlockConnected
            (NORMAL,(CValidationInterface *)&local_450,&local_788,local_790);
  BaseIndex::Stop(&local_450.super_BaseIndex);
  if ((pointer)local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_788.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr(&local_450.m_db);
  BaseIndex::~BaseIndex(&local_450.super_BaseIndex);
  interfaces::MakeChain((interfaces *)&local_870,context);
  pvVar13 = (iterator)0x0;
  CoinStatsIndex::CoinStatsIndex
            (&local_450,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)&local_870,
             0x100000,false,false);
  if (local_870 != (long *)0x0) {
    (**(code **)(*local_870 + 8))();
  }
  local_870 = (long *)0x0;
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x72;
  file_04.m_begin = (iterator)&local_880;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_890,
             msg_04);
  rVar6.super_class_property<bool>.value =
       (class_property<bool>)BaseIndex::Init(&local_450.super_BaseIndex);
  local_4e8._8_8_ = (element_type *)0x0;
  local_4e8._16_8_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "index.Init()";
  local_530.m_reject_reason._M_dataplus._M_p = "";
  local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffffffffff00;
  local_6f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_6e8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_898 = "";
  pvVar11 = (iterator)0x2;
  pvVar13 = (iterator)0x0;
  local_6e0 = &local_530;
  local_4e8[0] = rVar6.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4e8,(lazy_ostream *)local_6f8,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,cVar14),(size_t)&local_8a0,0x72);
  boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 0x10));
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x74;
  file_05.m_begin = (iterator)&local_8b0;
  msg_05.m_end = pvVar13;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_8c0,
             msg_05);
  local_4e8[0] = BaseIndex::StartBackgroundSync(&local_450.super_BaseIndex);
  local_4e8._8_8_ = (element_type *)0x0;
  local_4e8._16_8_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "index.StartBackgroundSync()";
  local_530.m_reject_reason._M_dataplus._M_p = "";
  local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffffffffff00;
  local_6f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_6e8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coinstatsindex_tests.cpp"
  ;
  local_8c8 = "";
  local_6e0 = &local_530;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4e8,(lazy_ostream *)local_6f8,2,0,WARN,
             CONCAT44(in_stack_fffffffffffff704,cVar14),(size_t)&local_8d0,0x74);
  boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 0x10));
  BaseIndex::Stop(&local_450.super_BaseIndex);
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr(&local_450.m_db);
  BaseIndex::~BaseIndex(&local_450.super_BaseIndex);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coinstatsindex_unclean_shutdown, TestChain100Setup)
{
    Chainstate& chainstate = Assert(m_node.chainman)->ActiveChainstate();
    const CChainParams& params = Params();
    {
        CoinStatsIndex index{interfaces::MakeChain(m_node), 1 << 20};
        BOOST_REQUIRE(index.Init());
        BOOST_REQUIRE(index.StartBackgroundSync());
        IndexWaitSynced(index, *Assert(m_node.shutdown));
        std::shared_ptr<const CBlock> new_block;
        CBlockIndex* new_block_index = nullptr;
        {
            const CScript script_pub_key{CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG};
            const CBlock block = this->CreateBlock({}, script_pub_key, chainstate);

            new_block = std::make_shared<CBlock>(block);

            LOCK(cs_main);
            BlockValidationState state;
            BOOST_CHECK(CheckBlock(block, state, params.GetConsensus()));
            BOOST_CHECK(m_node.chainman->AcceptBlock(new_block, state, &new_block_index, true, nullptr, nullptr, true));
            CCoinsViewCache view(&chainstate.CoinsTip());
            BOOST_CHECK(chainstate.ConnectBlock(block, state, new_block_index, view));
        }
        // Send block connected notification, then stop the index without
        // sending a chainstate flushed notification. Prior to #24138, this
        // would cause the index to be corrupted and fail to reload.
        ValidationInterfaceTest::BlockConnected(ChainstateRole::NORMAL, index, new_block, new_block_index);
        index.Stop();
    }

    {
        CoinStatsIndex index{interfaces::MakeChain(m_node), 1 << 20};
        BOOST_REQUIRE(index.Init());
        // Make sure the index can be loaded.
        BOOST_REQUIRE(index.StartBackgroundSync());
        index.Stop();
    }
}